

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O3

unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
 __thiscall
duckdb::GeoParquetFileMetadata::TryRead
          (GeoParquetFileMetadata *this,FileMetaData *file_meta_data,ClientContext *context)

{
  pointer pKVar1;
  char *pcVar2;
  char *pcVar3;
  pointer pcVar4;
  _func_void_void_ptr_void_ptr *p_Var5;
  bool bVar6;
  int iVar7;
  yyjson_doc *pyVar8;
  void *pvVar9;
  ulong uVar10;
  InvalidInputException *pIVar11;
  pointer pGVar12;
  mapped_type *pmVar13;
  yyjson_val *pyVar14;
  yyjson_val *pyVar15;
  ulong uVar16;
  uint64_t uVar17;
  pointer *__ptr;
  uint64_t uVar18;
  yyjson_val *key;
  yyjson_val *pyVar19;
  pointer pKVar20;
  string local_d0;
  allocator local_a9;
  char *local_a8;
  ulong local_a0;
  ulong local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar6 = IsGeoParquetConversionEnabled(context);
  if (bVar6) {
    pKVar1 = (file_meta_data->key_value_metadata).
             super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
             super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pKVar20 = (file_meta_data->key_value_metadata).
                   super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   .
                   super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   ._M_impl.super__Vector_impl_data._M_start; pKVar20 != pKVar1;
        pKVar20 = pKVar20 + 1) {
      iVar7 = ::std::__cxx11::string::compare((char *)&pKVar20->key);
      if (iVar7 == 0) {
        pyVar8 = duckdb_yyjson::yyjson_read_opts
                           ((pKVar20->value)._M_dataplus._M_p,(pKVar20->value)._M_string_length,0,
                            (yyjson_alc *)0x0,(yyjson_read_err *)0x0);
        if (pyVar8 != (yyjson_doc *)0x0) {
          pyVar19 = pyVar8->root;
          if ((pyVar19 == (yyjson_val *)0x0) || ((~(uint)pyVar19->tag & 7) != 0)) {
            pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"Geoparquet metadata is not an object","");
            InvalidInputException::InvalidInputException(pIVar11,&local_d0);
            __cxa_throw(pIVar11,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pvVar9 = operator_new(0xa0);
          switchD_01043a80::default(pvVar9,0,0x90);
          *(long *)((long)pvVar9 + 0x28) = (long)pvVar9 + 0x38;
          *(undefined4 *)((long)pvVar9 + 0x38) = 0x2e312e31;
          *(undefined1 *)((long)pvVar9 + 0x3c) = 0x30;
          *(undefined8 *)((long)pvVar9 + 0x30) = 5;
          *(long *)((long)pvVar9 + 0x48) = (long)pvVar9 + 0x58;
          *(long *)((long)pvVar9 + 0x68) = (long)pvVar9 + 0x98;
          *(undefined8 *)((long)pvVar9 + 0x70) = 1;
          *(undefined8 *)((long)pvVar9 + 0x78) = 0;
          *(undefined8 *)((long)pvVar9 + 0x80) = 0;
          *(undefined4 *)((long)pvVar9 + 0x88) = 0x3f800000;
          *(undefined8 *)((long)pvVar9 + 0x90) = 0;
          *(undefined8 *)((long)pvVar9 + 0x98) = 0;
          (this->write_lock).super___mutex_base._M_mutex.__align = (long)pvVar9;
          uVar10 = pyVar19->tag;
          if (((~(uint)uVar10 & 7) != 0) || (uVar10 < 0x100)) goto LAB_01b6eed6;
          pyVar14 = pyVar19 + 1;
          uVar10 = uVar10 >> 8;
          pyVar15 = pyVar14;
          goto LAB_01b6ee8a;
        }
        break;
      }
    }
  }
  (this->write_lock).super___mutex_base._M_mutex.__align = 0;
  return (unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
          )(unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
            )this;
LAB_01b6f259:
  if (local_a0 == local_98) {
    p_Var5 = (pyVar8->alc).free;
    pvVar9 = (pyVar8->alc).ctx;
    (pyVar8->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
    (pyVar8->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
    (pyVar8->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
    (pyVar8->alc).ctx = (void *)0x0;
    if (pyVar8->str_pool != (char *)0x0) {
      (*p_Var5)(pvVar9,pyVar8->str_pool);
    }
    (*p_Var5)(pvVar9,pyVar8);
    return (unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
            )(unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
              )this;
  }
  uVar18 = 0x10;
  if ((~(uint)pyVar19[1].tag & 6) == 0) {
    uVar18 = pyVar19[1].uni.u64;
  }
  if ((pyVar19->tag & 7) == 5) {
    local_a8 = (pyVar19->uni).str;
  }
  else {
    local_a8 = (char *)0x0;
  }
  pGVar12 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
            ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                          *)this);
  ::std::__cxx11::string::string((string *)&local_d0,local_a8,&local_a9);
  pmVar13 = ::std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pGVar12->geometry_columns,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  uVar10 = pyVar19[1].tag;
  if ((~(uint)uVar10 & 7) != 0) {
    pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Geoparquet column \'%s\' is not an object","");
    InvalidInputException::InvalidInputException<char_const*>(pIVar11,&local_d0,local_a8);
    __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (uVar10 < 0x100) {
LAB_01b6f49f:
    pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Geoparquet column \'%s\' does not have an encoding","");
    InvalidInputException::InvalidInputException<char_const*>(pIVar11,&local_d0,local_a8);
    __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_a0 = local_a0 + 1;
  uVar10 = uVar10 >> 8;
  pyVar15 = pyVar19 + 2;
  pyVar14 = pyVar15;
  uVar16 = uVar10;
  while (((pyVar14->tag & 0xffffffffffffff00) != 0x800 ||
         (*(long *)(pyVar14->uni).str != 0x676e69646f636e65))) {
    uVar17 = 0x10;
    if ((~(uint)pyVar14[1].tag & 6) == 0) {
      uVar17 = pyVar14[1].uni.u64;
    }
    pyVar14 = (yyjson_val *)((long)&pyVar14[1].tag + uVar17);
    uVar16 = uVar16 - 1;
    if (uVar16 == 0) goto LAB_01b6f49f;
  }
  if ((pyVar14[1].tag & 7) != 5) goto LAB_01b6f49f;
  iVar7 = strcmp(pyVar14[1].uni.str,"WKB");
  if (iVar7 != 0) {
    pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Geoparquet column \'%s\' has an unsupported encoding","");
    InvalidInputException::InvalidInputException<char_const*>(pIVar11,&local_d0,local_a8);
    __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pmVar13->geometry_encoding = WKB;
  while (((pyVar15->tag & 0xffffffffffffff00) != 0xe00 ||
         (*(long *)((long)(pyVar15->uni).str + 6) != 0x73657079745f7972 ||
          *(long *)(pyVar15->uni).str != 0x797274656d6f6567))) {
    uVar17 = 0x10;
    if ((~(uint)pyVar15[1].tag & 6) == 0) {
      uVar17 = pyVar15[1].uni.u64;
    }
    pyVar15 = (yyjson_val *)((long)&pyVar15[1].tag + uVar17);
    uVar10 = uVar10 - 1;
    if (uVar10 == 0) goto LAB_01b6f404;
  }
  pyVar19 = (yyjson_val *)((long)&pyVar19[1].tag + uVar18);
  if ((pyVar15[1].tag & 7) != 6) {
LAB_01b6f404:
    pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Geoparquet column \'%s\' does not have geometry types","");
    InvalidInputException::InvalidInputException<char_const*>(pIVar11,&local_d0,local_a8);
    __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  goto LAB_01b6f259;
  while( true ) {
    uVar18 = 0x10;
    if ((~(uint)pyVar15[1].tag & 6) == 0) {
      uVar18 = pyVar15[1].uni.u64;
    }
    pyVar15 = (yyjson_val *)((long)&pyVar15[1].tag + uVar18);
    uVar10 = uVar10 - 1;
    if (uVar10 == 0) break;
LAB_01b6ee8a:
    if (((pyVar15->tag & 0xffffffffffffff00) == 0x700) &&
       (*(int *)((long)(pyVar15->uni).str + 3) == 0x6e6f6973 &&
        *(int *)(pyVar15->uni).str == 0x73726576)) {
      if ((pyVar15[1].tag & 7) == 5) {
        pcVar2 = pyVar15[1].uni.str;
        pGVar12 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                  ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                                *)this);
        pcVar3 = (char *)(pGVar12->version)._M_string_length;
        strlen(pcVar2);
        ::std::__cxx11::string::_M_replace((ulong)&pGVar12->version,0,pcVar3,(ulong)pcVar2);
        pGVar12 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                  ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                                *)this);
        pcVar4 = (pGVar12->version)._M_dataplus._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar4,pcVar4 + (pGVar12->version)._M_string_length);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"2","");
        bVar6 = StringUtil::StartsWith(&local_70,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (bVar6) {
          pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"Geoparquet version %s is not supported","");
          pGVar12 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                    ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                                  *)this);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          pcVar4 = (pGVar12->version)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar4,pcVar4 + (pGVar12->version)._M_string_length);
          InvalidInputException::InvalidInputException<std::__cxx11::string>
                    (pIVar11,&local_d0,&local_50);
          __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        uVar10 = pyVar19->tag;
        if (uVar10 < 0x100 || (~(uint)uVar10 & 7) != 0) goto LAB_01b6f030;
        uVar10 = uVar10 >> 8;
        pyVar15 = pyVar14;
        goto LAB_01b6f0b2;
      }
      break;
    }
  }
LAB_01b6eed6:
  pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Geoparquet metadata does not have a version","");
  InvalidInputException::InvalidInputException(pIVar11,&local_d0);
  __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  while( true ) {
    uVar18 = 0x10;
    if ((~(uint)pyVar15[1].tag & 6) == 0) {
      uVar18 = pyVar15[1].uni.u64;
    }
    pyVar15 = (yyjson_val *)((long)&pyVar15[1].tag + uVar18);
    uVar10 = uVar10 - 1;
    if (uVar10 == 0) break;
LAB_01b6f0b2:
    if (((pyVar15->tag & 0xffffffffffffff00) == 0xe00) &&
       (*(long *)((long)(pyVar15->uni).str + 6) == 0x6e6d756c6f635f79 &&
        *(long *)(pyVar15->uni).str == 0x5f7972616d697270)) {
      if ((pyVar15[1].tag & 7) == 5) {
        pcVar2 = pyVar15[1].uni.str;
        pGVar12 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                  ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                                *)this);
        pcVar3 = (char *)(pGVar12->primary_geometry_column)._M_string_length;
        strlen(pcVar2);
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pGVar12->primary_geometry_column,0,pcVar3,(ulong)pcVar2);
        uVar10 = pyVar19->tag;
        if (uVar10 < 0x100 || (~(uint)uVar10 & 7) != 0) goto LAB_01b6f162;
        uVar10 = uVar10 >> 8;
        goto LAB_01b6f1d7;
      }
      break;
    }
  }
LAB_01b6f030:
  pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Geoparquet metadata does not have a primary column","");
  InvalidInputException::InvalidInputException(pIVar11,&local_d0);
  __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  while( true ) {
    uVar18 = 0x10;
    if ((~(uint)pyVar14[1].tag & 6) == 0) {
      uVar18 = pyVar14[1].uni.u64;
    }
    pyVar14 = (yyjson_val *)((long)&pyVar14[1].tag + uVar18);
    uVar10 = uVar10 - 1;
    if (uVar10 == 0) break;
LAB_01b6f1d7:
    if (((pyVar14->tag & 0xffffffffffffff00) == 0x700) &&
       (*(int *)((long)(pyVar14->uni).str + 3) == 0x736e6d75 &&
        *(int *)(pyVar14->uni).str == 0x756c6f63)) {
      if ((~(uint)pyVar14[1].tag & 7) == 0) {
        local_98 = pyVar14[1].tag >> 8;
        local_a0 = 0;
        pyVar19 = pyVar14 + 2;
        goto LAB_01b6f259;
      }
      break;
    }
  }
LAB_01b6f162:
  pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Geoparquet metadata does not have a columns object","");
  InvalidInputException::InvalidInputException(pIVar11,&local_d0);
  __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<GeoParquetFileMetadata> GeoParquetFileMetadata::TryRead(const duckdb_parquet::FileMetaData &file_meta_data,
                                                                   const ClientContext &context) {

	// Conversion not enabled, or spatial is not loaded!
	if (!IsGeoParquetConversionEnabled(context)) {
		return nullptr;
	}

	for (auto &kv : file_meta_data.key_value_metadata) {
		if (kv.key == "geo") {
			const auto geo_metadata = yyjson_read(kv.value.c_str(), kv.value.size(), 0);
			if (!geo_metadata) {
				// Could not parse the JSON
				return nullptr;
			}

			try {
				// Check the root object
				const auto root = yyjson_doc_get_root(geo_metadata);
				if (!yyjson_is_obj(root)) {
					throw InvalidInputException("Geoparquet metadata is not an object");
				}

				auto result = make_uniq<GeoParquetFileMetadata>();

				// Check and parse the version
				const auto version_val = yyjson_obj_get(root, "version");
				if (!yyjson_is_str(version_val)) {
					throw InvalidInputException("Geoparquet metadata does not have a version");
				}
				result->version = yyjson_get_str(version_val);
				if (StringUtil::StartsWith(result->version, "2")) {
					// Guard against a breaking future 2.0 version
					throw InvalidInputException("Geoparquet version %s is not supported", result->version);
				}

				// Check and parse the primary geometry column
				const auto primary_geometry_column_val = yyjson_obj_get(root, "primary_column");
				if (!yyjson_is_str(primary_geometry_column_val)) {
					throw InvalidInputException("Geoparquet metadata does not have a primary column");
				}
				result->primary_geometry_column = yyjson_get_str(primary_geometry_column_val);

				// Check and parse the geometry columns
				const auto columns_val = yyjson_obj_get(root, "columns");
				if (!yyjson_is_obj(columns_val)) {
					throw InvalidInputException("Geoparquet metadata does not have a columns object");
				}

				// Iterate over all geometry columns
				yyjson_obj_iter iter = yyjson_obj_iter_with(columns_val);
				yyjson_val *column_key;

				while ((column_key = yyjson_obj_iter_next(&iter))) {
					const auto column_val = yyjson_obj_iter_get_val(column_key);
					const auto column_name = yyjson_get_str(column_key);

					auto &column = result->geometry_columns[column_name];

					if (!yyjson_is_obj(column_val)) {
						throw InvalidInputException("Geoparquet column '%s' is not an object", column_name);
					}

					// Parse the encoding
					const auto encoding_val = yyjson_obj_get(column_val, "encoding");
					if (!yyjson_is_str(encoding_val)) {
						throw InvalidInputException("Geoparquet column '%s' does not have an encoding", column_name);
					}
					const auto encoding_str = yyjson_get_str(encoding_val);
					if (strcmp(encoding_str, "WKB") == 0) {
						column.geometry_encoding = GeoParquetColumnEncoding::WKB;
					} else {
						throw InvalidInputException("Geoparquet column '%s' has an unsupported encoding", column_name);
					}

					// Parse the geometry types
					const auto geometry_types_val = yyjson_obj_get(column_val, "geometry_types");
					if (!yyjson_is_arr(geometry_types_val)) {
						throw InvalidInputException("Geoparquet column '%s' does not have geometry types", column_name);
					}
					// We dont care about the geometry types for now.

					// TODO: Parse the bounding box, other metadata that might be useful.
					// (Only encoding and geometry types are required to be present)
				}

				// Return the result
				// Make sure to free the JSON document
				yyjson_doc_free(geo_metadata);
				return result;

			} catch (...) {
				// Make sure to free the JSON document in case of an exception
				yyjson_doc_free(geo_metadata);
				throw;
			}
		}
	}
	return nullptr;
}